

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O3

ZCC_Expression * __thiscall
ZCCCompiler::SimplifyFunctionCall(ZCCCompiler *this,ZCC_ExprFuncCall *callop)

{
  PType *target;
  ZCC_ExprConstant *pZVar1;
  uint uVar2;
  ZCC_Expression *pZVar3;
  char *msg;
  int iVar4;
  ZCC_FuncParm *pZVar5;
  ulong uVar6;
  Conversion *route [8];
  Conversion *local_78 [9];
  
  pZVar3 = Simplify(this,callop->Function);
  callop->Function = pZVar3;
  pZVar5 = callop->Parameters;
  if (pZVar5 == (ZCC_FuncParm *)0x0) {
    if (pZVar3->Operation != PEX_TypeRef) {
      return &callop->super_ZCC_Expression;
    }
  }
  else {
    iVar4 = 1;
    do {
      if ((pZVar5->super_ZCC_TreeNode).NodeType != AST_FuncParm) {
        __assert_fail("parm->NodeType == AST_FuncParm",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                      ,0x16f,"ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *)"
                     );
      }
      pZVar3 = Simplify(this,pZVar5->Value);
      pZVar5->Value = pZVar3;
      pZVar5 = (ZCC_FuncParm *)(pZVar5->super_ZCC_TreeNode).SiblingNext;
      iVar4 = iVar4 + -1;
    } while (pZVar5 != callop->Parameters);
    if (callop->Function->Operation != PEX_TypeRef) {
      return &callop->super_ZCC_Expression;
    }
    if (iVar4 == 0) {
      target = (PType *)callop->Function[1].super_ZCC_TreeNode.SiblingNext;
      uVar2 = PType::FindConversion(pZVar5->Value->Type,target,local_78,8);
      if (-1 < (int)uVar2) {
        pZVar1 = (ZCC_ExprConstant *)pZVar5->Value;
        if (uVar2 != 0) {
          uVar6 = 0;
          do {
            if ((pZVar1->super_ZCC_Expression).Operation == PEX_ConstValue) {
              (*local_78[uVar6]->ConvertConstant)(pZVar1,&this->AST->Strings);
            }
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        if ((pZVar1->super_ZCC_Expression).Type == target) {
          return &pZVar1->super_ZCC_Expression;
        }
        __assert_fail("val->Type == dest",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                      ,0x18c,"ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *)"
                     );
      }
      msg = "Cannot convert type 1 to type 2";
      goto LAB_006c83e1;
    }
  }
  msg = "Type cast requires one parameter";
LAB_006c83e1:
  Error(this,(ZCC_TreeNode *)callop,msg);
  (callop->super_ZCC_Expression).Type = &TypeError->super_PType;
  *(undefined8 *)&(callop->super_ZCC_Expression).super_ZCC_TreeNode.NodeType = 0x14;
  return &callop->super_ZCC_Expression;
}

Assistant:

ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *callop)
{
	ZCC_FuncParm *parm;
	int parmcount = 0;

	callop->Function = Simplify(callop->Function);
	parm = callop->Parameters;
	if (parm != NULL)
	{
		do
		{
			parmcount++;
			assert(parm->NodeType == AST_FuncParm);
			parm->Value = Simplify(parm->Value);
			parm = static_cast<ZCC_FuncParm *>(parm->SiblingNext);
		}
		while (parm != callop->Parameters);
	}
	// If the left side is a type ref, then this is actually a cast
	// and not a function call.
	if (callop->Function->Operation == PEX_TypeRef)
	{
		if (parmcount != 1)
		{
			Error(callop, "Type cast requires one parameter");
			callop->ToErrorNode();
		}
		else
		{
			PType *dest = static_cast<ZCC_ExprTypeRef *>(callop->Function)->RefType;
			const PType::Conversion *route[CONVERSION_ROUTE_SIZE];
			int routelen = parm->Value->Type->FindConversion(dest, route, countof(route));
			if (routelen < 0)
			{
				///FIXME: Need real type names
				Error(callop, "Cannot convert type 1 to type 2");
				callop->ToErrorNode();
			}
			else
			{
				ZCC_Expression *val = ApplyConversion(parm->Value, route, routelen);
				assert(val->Type == dest);
				return val;
			}
		}
	}
	return callop;
}